

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.h
# Opt level: O0

cmCommand * __thiscall cmIfCommand::Clone(cmIfCommand *this)

{
  cmCommand *this_00;
  cmIfCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmIfCommand((cmIfCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmIfCommand; }